

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::CreateParticleUpperBound(POMDPX *this)

{
  string *in_RSI;
  
  CreateParticleUpperBound((POMDPX *)&this[-1].memory_pool_.freelist_,in_RSI);
  return;
}

Assistant:

ParticleUpperBound* POMDPX::CreateParticleUpperBound(string name) const {
	if (!is_small_) {
		return new TrivialParticleUpperBound(this);
	}

	const StateIndexer* indexer = this;
	const MDP* mdp = this;

	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP" || name == "DEFAULT") {
		return new MDPUpperBound(mdp, *indexer);
	} else {
		cerr << "Unsupported particle upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}